

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O1

SENode * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetFinalTripInductionNode
          (LoopDependenceAnalysis *this,Loop *loop,SENode *induction_coefficient)

{
  ScalarEvolutionAnalysis *this_00;
  SENode *pSVar1;
  SENode *pSVar2;
  SENode *operand_2;
  
  pSVar1 = GetFirstTripInductionNode(this,loop);
  if (pSVar1 != (SENode *)0x0) {
    this_00 = &this->scalar_evolution_;
    pSVar2 = GetTripCount(this,loop);
    operand_2 = ScalarEvolutionAnalysis::CreateConstant(this_00,1);
    pSVar2 = ScalarEvolutionAnalysis::CreateSubtraction(this_00,pSVar2,operand_2);
    pSVar2 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar2);
    pSVar2 = ScalarEvolutionAnalysis::CreateMultiplyNode(this_00,pSVar2,induction_coefficient);
    pSVar1 = ScalarEvolutionAnalysis::CreateAddNode(this_00,pSVar1,pSVar2);
    pSVar1 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar1);
    return pSVar1;
  }
  return (SENode *)0x0;
}

Assistant:

SENode* LoopDependenceAnalysis::GetFinalTripInductionNode(
    const Loop* loop, SENode* induction_coefficient) {
  SENode* first_trip_induction_node = GetFirstTripInductionNode(loop);
  if (!first_trip_induction_node) {
    return nullptr;
  }
  // Get trip_count as GetTripCount - 1
  // This is because the induction variable is not stepped on the first
  // iteration of the loop
  SENode* trip_count =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateSubtraction(
          GetTripCount(loop), scalar_evolution_.CreateConstant(1)));
  // Return first_trip_induction_node + trip_count * induction_coefficient
  return scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateAddNode(
      first_trip_induction_node,
      scalar_evolution_.CreateMultiplyNode(trip_count, induction_coefficient)));
}